

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O1

char * copyTypeEncoding(char *types)

{
  char *pcVar1;
  size_t __n;
  size_t ignored;
  size_t local_20;
  
  if ((types == (char *)0x0) || (*types == '\0')) {
    __n = 0;
  }
  else {
    local_20 = 0;
    pcVar1 = sizeof_type(types,&local_20);
    __n = (long)pcVar1 - (long)types;
  }
  pcVar1 = (char *)malloc(__n + 1);
  memcpy(pcVar1,types,__n);
  pcVar1[__n] = '\0';
  return pcVar1;
}

Assistant:

static char* copyTypeEncoding(const char *types)
{
	size_t length = lengthOfTypeEncoding(types);
	char *copy = malloc(length + 1);
	memcpy(copy, types, length);
	copy[length] = '\0';
	return copy;
}